

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  long *plVar1;
  uint *puVar2;
  byte bVar3;
  Tolerances *pTVar4;
  Real RVar5;
  double dVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ostream *poVar12;
  undefined3 in_register_00000081;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  char *pcVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  VectorRational primal_1;
  ofstream outfile;
  undefined1 auStack_388 [8];
  undefined8 local_380;
  int local_374;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_370;
  undefined1 local_358 [16];
  pointer local_348;
  uint auStack_340 [2];
  uint local_338 [2];
  int local_330;
  bool local_32c;
  long local_328;
  data_type local_318;
  undefined5 local_308;
  char cStack_303;
  char cStack_302;
  undefined6 uStack_301;
  undefined3 uStack_2fb;
  uint local_2f8;
  undefined4 uStack_2f4;
  undefined5 local_2f0;
  undefined3 uStack_2eb;
  undefined8 local_2e8;
  ulong local_2d0;
  long local_2c8;
  undefined4 local_2bc;
  undefined1 local_2b8 [16];
  long local_2a8;
  undefined8 uStack_2a0;
  long local_290;
  pointer local_288;
  pointer pnStack_280;
  pointer local_278;
  uint auStack_270 [2];
  uint local_268 [4];
  pointer local_258;
  pointer pnStack_250;
  pointer local_248;
  uint auStack_240 [2];
  uint local_238 [2];
  long local_230;
  filebuf local_228 [8];
  long lStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  local_2bc = CONCAT31(in_register_00000081,real);
  pTVar4 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var14 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
  dVar6 = log10(RVar5);
  local_2b8._8_4_ = extraout_XMM0_Dc;
  local_2b8._0_8_ = dVar6;
  local_2b8._12_4_ = extraout_XMM0_Dd;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  local_2d0 = (ulong)(uint)(int)-(double)local_2b8._0_8_;
  local_374 = (int)-(double)local_2b8._0_8_ + 10;
  local_2b8._0_8_ = colnames;
  if ((char)rownames == '\0') goto LAB_00137c6e;
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_370,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar8 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getPrimalRay(soplex,&local_370);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_380 = (long)local_374;
      local_2c8 = (long)(int)local_2d0;
      lVar15 = 0;
      lVar13 = 0;
      do {
        local_238 = *(uint (*) [2])
                     ((long)((local_370.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar15 + 0x20);
        plVar1 = (long *)((long)((local_370.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar15);
        local_258 = (pointer)*plVar1;
        pnStack_250 = (pointer)plVar1[1];
        puVar2 = (uint *)((long)((local_370.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar15 + 0x10);
        local_248 = *(pointer *)puVar2;
        auStack_240 = *(uint (*) [2])(puVar2 + 2);
        iVar9 = *(int *)((long)(&((local_370.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                        + lVar15);
        bVar3 = *(byte *)((long)(&((local_370.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                         + lVar15 + 4);
        local_2a8 = *(long *)((long)(&((local_370.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                    + 1) + lVar15 + 8);
        uStack_2a0 = 0;
        pTVar4 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (soplex->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
        local_338[0] = local_238[0];
        local_338[1] = local_238[1];
        local_348 = local_248;
        auStack_340[0] = auStack_240[0];
        auStack_340[1] = auStack_240[1];
        local_358._0_8_ = local_258;
        uVar7 = local_358._0_8_;
        local_358._8_8_ = pnStack_250;
        local_328 = local_2a8;
        local_32c = (bool)bVar3;
        if ((bVar3 != 0) &&
           (local_358._0_4_ = SUB84(local_258,0), local_358._0_4_ != 0 || (int)local_2a8 != 0)) {
          local_32c = (bool)(bVar3 ^ 1);
        }
        bVar8 = false;
        local_358._0_8_ = uVar7;
        local_330 = iVar9;
        if (((int)local_2a8 != 2) && (!NAN(RVar5))) {
          local_2e8 = 0xa00000000;
          local_318.double_first = 0;
          local_308 = 0;
          cStack_303 = '\0';
          cStack_302 = '\0';
          uStack_301 = 0;
          uStack_2fb = 0;
          local_2f8 = 0;
          uStack_2f4 = 0;
          local_2f0 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_318.ld,RVar5);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)local_358,
                             (cpp_dec_float<50U,_int,_void> *)&local_318.ld);
          bVar8 = 0 < iVar9;
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        if (bVar8) {
          if (*(long *)(local_2b8._0_8_ + 0x20) == 0) {
            std::ios::clear((int)auStack_388 + (int)*(undefined8 *)(local_230 + -0x18) + 0x158);
          }
          else {
            pcVar16 = (char *)(*(long *)(local_2b8._0_8_ + 0x20) +
                              (long)*(int *)(*(long *)local_2b8._0_8_ +
                                            (long)*(int *)(*(long *)(local_2b8._0_8_ + 8) + 4 +
                                                          lVar13 * 8) * 8));
            sVar11 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar16,sVar11)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_380;
          *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_2c8;
          poVar12 = boost::multiprecision::operator<<
                              ((ostream *)&local_230,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)((local_370.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar15));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        lVar13 = lVar13 + 1;
        lVar15 = lVar15 + 0x38;
      } while (lVar13 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"All other entries are zero (within ",0x23);
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
    *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
    pTVar4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = (soplex->_tolerances).
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
    poVar12 = std::ostream::_M_insert<double>(RVar5);
    lVar13 = *(long *)poVar12;
    *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
    lVar13 = *(long *)(lVar13 + -0x18);
    *(uint *)(poVar12 + lVar13 + 0x18) = *(uint *)(poVar12 + lVar13 + 0x18) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
LAB_00137c4a:
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
  }
  else {
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar8 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimal(soplex,&local_370), bVar8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        local_380 = (ulong)local_380._4_4_ << 0x20;
      }
      else {
        local_2c8 = (long)local_374;
        local_290 = (long)(int)local_2d0;
        lVar13 = 0;
        lVar15 = 0;
        local_380 = (ulong)local_380._4_4_ << 0x20;
        do {
          local_268._0_8_ =
               *(undefined8 *)
                ((long)((local_370.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar13 + 0x20);
          plVar1 = (long *)((long)((local_370.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13);
          local_288 = (pointer)*plVar1;
          pnStack_280 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)((local_370.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13 + 0x10);
          local_278 = *(pointer *)puVar2;
          auStack_270 = *(uint (*) [2])(puVar2 + 2);
          iVar9 = *(int *)((long)(&((local_370.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1
                                 ) + lVar13);
          bVar3 = *(byte *)((long)(&((local_370.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                                  1) + lVar13 + 4);
          local_2a8 = *(long *)((long)(&((local_370.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                        data + 1) + lVar13 + 8);
          uStack_2a0 = 0;
          pTVar4 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var14 = (soplex->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
          local_338[0] = local_268[0];
          local_338[1] = local_268[1];
          local_348 = local_278;
          auStack_340[0] = auStack_270[0];
          auStack_340[1] = auStack_270[1];
          local_358._0_8_ = local_288;
          uVar7 = local_358._0_8_;
          local_358._8_8_ = pnStack_280;
          local_328 = local_2a8;
          local_32c = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_358._0_4_ = SUB84(local_288,0), local_358._0_4_ != 0 || (int)local_2a8 != 0)) {
            local_32c = (bool)(bVar3 ^ 1);
          }
          bVar8 = false;
          local_358._0_8_ = uVar7;
          local_330 = iVar9;
          if (((int)local_2a8 != 2) && (!NAN(RVar5))) {
            local_2e8 = 0xa00000000;
            local_318.double_first = 0;
            local_308 = 0;
            cStack_303 = '\0';
            cStack_302 = '\0';
            uStack_301 = 0;
            uStack_2fb = 0;
            local_2f8 = 0;
            uStack_2f4 = 0;
            local_2f0 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_318.ld,RVar5);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_358,
                               (cpp_dec_float<50U,_int,_void> *)&local_318.ld);
            bVar8 = 0 < iVar9;
          }
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if (bVar8) {
            if (*(long *)(local_2b8._0_8_ + 0x20) == 0) {
              std::ios::clear((int)auStack_388 + (int)*(undefined8 *)(local_230 + -0x18) + 0x158);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_2b8._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_2b8._0_8_ +
                                              (long)*(int *)(*(long *)(local_2b8._0_8_ + 8) + 4 +
                                                            lVar15 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_2c8;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_290;
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)((local_370.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           data._M_elems + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            local_380 = CONCAT44(local_380._4_4_,(int)local_380 + 1);
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x38;
        } while (lVar15 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero (within ",0x25);
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      pTVar4 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = (soplex->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
      poVar12 = std::ostream::_M_insert<double>(RVar5);
      lVar13 = *(long *)poVar12;
      *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
      lVar13 = *(long *)(lVar13 + -0x18);
      *(uint *)(poVar12 + lVar13 + 0x18) = *(uint *)(poVar12 + lVar13 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"). Solution has ",0x10);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)local_380);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      goto LAB_00137c4a;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"No primal information available.\n",0x21);
  }
  if (local_370.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_370.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00137c6e:
  if ((char)local_2bc != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_358,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar8 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)local_358);
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_2a8 = (long)local_374;
        local_380 = (long)(int)local_2d0;
        lVar13 = 0;
        lVar15 = 0;
        do {
          uVar7 = local_358._0_8_;
          local_370.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_318.ld,(longlong *)&local_370,(type *)0x0);
          iVar9 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)uVar7)->m_value).num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar13),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_318.ld);
          if ((local_2e8._5_1_ == '\0') && (local_2e8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_2eb,local_2f0),(ulong)local_2f8 << 3);
          }
          if ((cStack_303 == '\0') && (cStack_302 == '\0')) {
            operator_delete(local_318.ld.data,(ulong)local_318.ld.capacity << 3);
          }
          if (iVar9 != 0) {
            if (*(long *)(local_2b8._0_8_ + 0x20) == 0) {
              std::ios::clear((int)auStack_388 + (int)*(undefined8 *)(local_230 + -0x18) + 0x158);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_2b8._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_2b8._0_8_ +
                                              (long)*(int *)(*(long *)(local_2b8._0_8_ + 8) + 4 +
                                                            lVar15 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_2a8;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_380;
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_358._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x40;
        } while (lVar15 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other entries are zero.",0x1b);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar8 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                            *)local_358), bVar8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum < 1) {
        iVar9 = 0;
      }
      else {
        lVar13 = 0;
        lVar15 = 0;
        iVar9 = 0;
        do {
          uVar7 = local_358._0_8_;
          local_370.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_318.ld,(longlong *)&local_370,(type *)0x0);
          iVar10 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar7)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar13),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_318.ld);
          if ((local_2e8._5_1_ == '\0') && (local_2e8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_2eb,local_2f0),(ulong)local_2f8 << 3);
          }
          if ((cStack_303 == '\0') && (cStack_302 == '\0')) {
            operator_delete(local_318.ld.data,(ulong)local_318.ld.capacity << 3);
          }
          if (iVar10 != 0) {
            if (*(long *)(local_2b8._0_8_ + 0x20) == 0) {
              std::ios::clear((int)auStack_388 + (int)*(undefined8 *)(local_230 + -0x18) + 0x158);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_2b8._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_2b8._0_8_ +
                                              (long)*(int *)(*(long *)(local_2b8._0_8_ + 8) + 4 +
                                                            lVar15 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_358._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            iVar9 = iVar9 + 1;
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x40;
        } while (lVar15 < (soplex->_rationalLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero. Solution has ",0x2b);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"No primal (rational) solution available.\n",0x29);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_358);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}